

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O0

filter * filter_init(int len,float *taps)

{
  filter *__s;
  float *pfVar1;
  filter *f;
  float *taps_local;
  int len_local;
  
  __s = (filter *)hmalloc(0x1018);
  memset(__s,0,0x1018);
  pfVar1 = (float *)hmalloc((long)len << 2);
  __s->taps = pfVar1;
  memcpy(__s->taps,taps,(long)len << 2);
  __s->length = len;
  __s->pointer = __s->length;
  return __s;
}

Assistant:

struct filter *filter_init(int len, float *taps)
{
	struct filter *f;

	f = (struct filter *) hmalloc(sizeof(struct filter));
	memset(f, 0, sizeof(struct filter));

	f->taps = (float *) hmalloc(len * sizeof(float));
	memcpy(f->taps, taps, len * sizeof(float));

	f->length = len;
	f->pointer = f->length;

	return f;
}